

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.cpp
# Opt level: O3

void __thiscall
Nova::Grid<float,_2>::Nodes_In_Cell_From_Minimum_Corner_Node
          (Grid<float,_2> *this,T_INDEX *minimum_corner_node,T_INDEX *nodes)

{
  undefined8 uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  int local_8;
  int local_4;
  
  uVar4 = 0;
  local_8 = 0;
  local_4 = 0;
  do {
    uVar1 = *(undefined8 *)(minimum_corner_node->_data)._M_elems;
    iVar2 = (int)(uVar4 >> 0x20);
    *(ulong *)(nodes->_data)._M_elems =
         CONCAT44(iVar2 + (int)((ulong)uVar1 >> 0x20),(int)uVar4 + (int)uVar1);
    uVar5 = uVar4 >> 0x20;
    piVar3 = &local_8;
    if (iVar2 != 0 && -1 < (long)uVar4) {
      local_8 = 0;
      uVar5 = uVar4;
      piVar3 = &local_4;
    }
    *piVar3 = (int)uVar5 + 1;
    uVar4 = CONCAT44(local_8,local_4);
    nodes = nodes + 1;
  } while (local_4 < 2);
  return;
}

Assistant:

void Grid<T,d>::
Nodes_In_Cell_From_Minimum_Corner_Node(const T_INDEX& minimum_corner_node,T_INDEX nodes[number_of_nodes_per_cell]) const
{
    int node=0;
    for(Range_Iterator<d> iterator(Range<int,d>(T_INDEX(),T_INDEX(1)));iterator.Valid();iterator.Next())
        nodes[node++]=minimum_corner_node+iterator.Index();
}